

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double orient2dfast(double *pa,double *pb,double *pc)

{
  double bcy;
  double acy;
  double bcx;
  double acx;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  return (*pa - *pc) * (pb[1] - pc[1]) + -((pa[1] - pc[1]) * (*pb - *pc));
}

Assistant:

REAL orient2dfast(REAL *pa, REAL *pb, REAL *pc)
{
  REAL acx, bcx, acy, bcy;

  acx = pa[0] - pc[0];
  bcx = pb[0] - pc[0];
  acy = pa[1] - pc[1];
  bcy = pb[1] - pc[1];
  return acx * bcy - acy * bcx;
}